

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

lua_Unsigned luaH_getn(Table *t)

{
  uint uVar1;
  uint uVar2;
  uint local_20;
  uint m;
  uint i;
  uint j;
  Table *t_local;
  
  m = t->sizearray;
  if ((m == 0) || (t->array[m - 1].tt_ != 0)) {
    if (t->lastfree == (Node *)0x0) {
      t_local = (Table *)(ulong)m;
    }
    else {
      t_local = (Table *)unbound_search(t,(ulong)m);
    }
  }
  else {
    local_20 = 0;
    uVar1 = local_20;
    while (local_20 = uVar1, 1 < m - local_20) {
      uVar2 = local_20 + m >> 1;
      uVar1 = uVar2;
      if (t->array[uVar2 - 1].tt_ == 0) {
        uVar1 = local_20;
        m = uVar2;
      }
    }
    t_local = (Table *)(ulong)local_20;
  }
  return (lua_Unsigned)t_local;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned int j;
  j = t->sizearray;
  if (j > 0 && ttisnil(&t->array[j - 1])) {
    /* there is a boundary in the array part: (binary) search for it */
    unsigned int i = 0;
    while (j - i > 1) {
      unsigned int m = (i+j)/2;
      if (ttisnil(&t->array[m - 1])) j = m;
      else i = m;
    }
    return i;
  }
  /* else must find a boundary in hash part */
  else if (isdummy(t))  /* hash part is empty? */
    return j;  /* that is easy... */
  else return unbound_search(t, j);
}